

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsuite.c
# Opt level: O2

int testResourceLoader(void *vctxt,char *URL,char *ID,xmlResourceType type,int flags,
                      xmlParserInputPtr *out)

{
  char *__s1;
  ulong uVar1;
  int iVar2;
  xmlParserInputPtr pxVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = (ulong)(uint)nb_entities;
  if (nb_entities < 1) {
    uVar5 = 0;
  }
  uVar1 = 0;
  do {
    uVar4 = uVar1;
    if (uVar5 * 8 == uVar4) {
      iVar2 = xmlNewInputFromUrl(URL,0,out);
      return iVar2;
    }
    __s1 = *(char **)((long)testEntitiesName + uVar4);
    iVar2 = strcmp(__s1,URL);
    uVar1 = uVar4 + 8;
  } while (iVar2 != 0);
  pxVar3 = (xmlParserInputPtr)
           xmlNewInputFromString(__s1,*(undefined8 *)((long)testEntitiesValue + uVar4),2);
  *out = pxVar3;
  return 0;
}

Assistant:

static int
testResourceLoader(void *vctxt ATTRIBUTE_UNUSED, const char *URL,
                   const char *ID ATTRIBUTE_UNUSED,
                   xmlResourceType type ATTRIBUTE_UNUSED,
                   int flags ATTRIBUTE_UNUSED, xmlParserInputPtr *out) {
    int i;

    for (i = 0; i < nb_entities; i++) {
        if (!strcmp(testEntitiesName[i], URL)) {
	    *out = xmlNewInputFromString(testEntitiesName[i],
                                        testEntitiesValue[i],
                                        XML_INPUT_BUF_STATIC);
	    return(XML_ERR_OK);
	}
    }

    return(xmlNewInputFromUrl(URL, 0, out));
}